

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseThreeCharToken
               (State *state,char *three_char_token)

{
  bool bVar1;
  char *pcVar2;
  ComplexityGuard local_28;
  ComplexityGuard guard;
  char *three_char_token_local;
  State *state_local;
  
  guard.state_ = (State *)three_char_token;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_28,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_28);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    pcVar2 = RemainingInput(state);
    if (*pcVar2 == *(char *)&(guard.state_)->mangled_begin) {
      pcVar2 = RemainingInput(state);
      if (pcVar2[1] == *(char *)((long)&(guard.state_)->mangled_begin + 1)) {
        pcVar2 = RemainingInput(state);
        if (pcVar2[2] == *(char *)((long)&(guard.state_)->mangled_begin + 2)) {
          (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 3;
          anon_unknown_3::UpdateHighWaterMark(state);
          state_local._7_1_ = true;
          goto LAB_006bedfc;
        }
      }
    }
    state_local._7_1_ = false;
  }
LAB_006bedfc:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_28);
  return state_local._7_1_;
}

Assistant:

static bool ParseThreeCharToken(State *state, const char *three_char_token) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (RemainingInput(state)[0] == three_char_token[0] &&
      RemainingInput(state)[1] == three_char_token[1] &&
      RemainingInput(state)[2] == three_char_token[2]) {
    state->parse_state.mangled_idx += 3;
    UpdateHighWaterMark(state);
    return true;
  }
  return false;
}